

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool duckdb::SubtractPropagateStatistics::Operation<long,duckdb::TryDecimalSubtract>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  Value local_70;
  
  lVar1 = NumericStats::GetMin<long>(lstats);
  lVar2 = NumericStats::GetMax<long>(rstats);
  if (lVar2 < 0) {
    if (lVar2 + 999999999999999999 < lVar1) {
      return true;
    }
  }
  else if (lVar1 < lVar2 + -999999999999999999) {
    return true;
  }
  lVar3 = NumericStats::GetMax<long>(lstats);
  lVar4 = NumericStats::GetMin<long>(rstats);
  if (lVar4 < 0) {
    if (lVar4 + 999999999999999999 < lVar3) {
      return true;
    }
  }
  else if (lVar3 < lVar4 + -999999999999999999) {
    return true;
  }
  Value::Numeric(&local_70,type,lVar1 - lVar2);
  Value::operator=(new_min,&local_70);
  Value::~Value(&local_70);
  Value::Numeric(&local_70,type,lVar3 - lVar4);
  Value::operator=(new_max,&local_70);
  Value::~Value(&local_70);
  return false;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(rstats), min)) {
			return true;
		}
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMin<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}